

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1491_avgSalary.cpp
# Opt level: O3

double average(vector<int,_std::allocator<int>_> *salary)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  piVar2 = (salary->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (salary->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar4 = (long)piVar3 - (long)piVar2 >> 2;
  if (piVar3 == piVar2) {
    dVar8 = -1001000.0;
  }
  else {
    iVar6 = 1000000;
    iVar5 = 1000;
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      iVar1 = piVar2[lVar7];
      dVar8 = dVar8 + (double)iVar1;
      if (iVar1 < iVar6) {
        iVar6 = iVar1;
      }
      if (iVar5 < iVar1) {
        iVar5 = iVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar7);
    dVar8 = dVar8 - (double)(iVar5 + iVar6);
  }
  lVar4 = lVar4 + -2;
  auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar9._0_8_ = lVar4;
  auVar9._12_4_ = 0x45300000;
  return dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
}

Assistant:

double average(vector<int>& salary) {
        int sal_min=1e6, sal_max=1e3;
        double net=0;
        for (int i=0; i<salary.size(); i++)
        {
        	net+=salary[i];
        	if (salary[i]<=sal_min)
        		sal_min=salary[i];
        	if (salary[i]>=sal_max)
        		sal_max=salary[i];
        }
        net-=(sal_max+sal_min);
        net/=(salary.size()-2);
        return net;
    }